

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

void __thiscall
HighsLinearSumBounds::updatedImplVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldImplVarUpper,HighsInt oldImplVarUpperSource)

{
  int *piVar1;
  double *pdVar2;
  pointer piVar3;
  pointer pHVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double oldImplVarUpper_local;
  
  oldImplVarUpper_local = oldImplVarUpper;
  pdVar2 = this->varUpper;
  pdVar5 = pdVar2 + var;
  if ((oldImplVarUpperSource != sum) && (oldImplVarUpper < *pdVar5 || oldImplVarUpper == *pdVar5)) {
    pdVar5 = &oldImplVarUpper_local;
  }
  dVar7 = *pdVar5;
  if (this->implVarUpperSource[var] == sum) {
    dVar6 = pdVar2[var];
  }
  else {
    dVar6 = pdVar2[var];
    if (this->implVarUpper[var] <= pdVar2[var]) {
      dVar6 = this->implVarUpper[var];
    }
  }
  if ((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) {
    return;
  }
  if (coefficient <= 0.0) {
    if (dVar7 < INFINITY) {
      dVar7 = dVar7 * coefficient;
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar4[sum].hi;
      dVar9 = dVar8 - dVar7;
      pHVar4[sum].hi = dVar9;
      pHVar4[sum].lo =
           (dVar8 - (dVar7 + dVar9)) + (-dVar7 - (dVar9 - (dVar7 + dVar9))) + pHVar4[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (dVar6 < INFINITY) {
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      goto LAB_00377c89;
    }
    piVar3 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if (dVar7 < INFINITY) {
      dVar7 = dVar7 * coefficient;
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar4[sum].hi;
      dVar9 = dVar8 - dVar7;
      pHVar4[sum].hi = dVar9;
      pHVar4[sum].lo =
           (dVar8 - (dVar7 + dVar9)) + (-dVar7 - (dVar9 - (dVar7 + dVar9))) + pHVar4[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (dVar6 < INFINITY) {
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_00377c89:
      dVar6 = dVar6 * coefficient;
      dVar7 = pHVar4[sum].hi;
      dVar8 = dVar6 + dVar7;
      pHVar4[sum].hi = dVar8;
      pHVar4[sum].lo =
           (dVar7 - (dVar8 - dVar6)) + (dVar6 - (dVar8 - (dVar8 - dVar6))) + pHVar4[sum].lo;
      return;
    }
    piVar3 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar3[sum] = piVar3[sum] + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedImplVarUpper(HighsInt sum, HighsInt var,
                                               double coefficient,
                                               double oldImplVarUpper,
                                               HighsInt oldImplVarUpperSource) {
  double oldVUpper = oldImplVarUpperSource == sum
                         ? varUpper[var]
                         : std::min(oldImplVarUpper, varUpper[var]);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (vUpper == oldVUpper) return;

  if (coefficient > 0) {
    if (oldVUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;
  } else {
    if (oldVUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;
  }
}